

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttobin.cpp
# Opt level: O2

void __thiscall FootprintToBin::WriteIdxFootprintFile(FootprintToBin *this)

{
  longlong *plVar1;
  pointer pEVar2;
  size_t __size;
  unsigned_long zippedEventRowsLength;
  vector<unsigned_char,_std::allocator<unsigned_char>_> zer;
  
  (this->idx_).event_id = (this->super_ValidateFootprint).prevEventID_;
  (this->idx_).size = (long)this->rowCount_ * 0xc;
  if (this->zip_ == true) {
    zer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    zer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    zer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&zer,(long)(this->eventRows_).super__Vector_base<EventRow,_std::allocator<EventRow>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                    (0x400 - (long)(this->eventRows_).
                                   super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
                                   super__Vector_impl_data._M_start));
    __size = (long)zer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)zer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    compress();
    fwrite(zer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,__size,1,(FILE *)this->fileOutBin_);
    (this->idx_).size = __size;
    pEVar2 = (this->eventRows_).super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->eventRows_).super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
        super__Vector_impl_data._M_finish != pEVar2) {
      (this->eventRows_).super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
      super__Vector_impl_data._M_finish = pEVar2;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&zer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  fwrite(&this->idx_,0x14,1,(FILE *)this->fileOutIdx_);
  if (this->uncompressedSize_ == true) {
    zer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((long)this->rowCount_ * 0xc);
    fwrite(&zer,8,1,(FILE *)this->fileOutIdx_);
  }
  plVar1 = &(this->idx_).offset;
  *plVar1 = *plVar1 + (this->idx_).size;
  this->rowCount_ = 0;
  return;
}

Assistant:

void FootprintToBin::WriteIdxFootprintFile() {

  idx_.event_id = prevEventID_;
  idx_.size = rowCount_ * sizeof(EventRow);

  // Write zipped output to binary file
  if (zip_) {

    std::vector<unsigned char> zer;
    zer.resize(eventRows_.size() * sizeof(EventRow) + 1024);
    unsigned long zippedEventRowsLength = zer.size();
    compress(&zer[0], &zippedEventRowsLength, (unsigned char*)&eventRows_[0],
	     eventRows_.size() * sizeof(EventRow));
    fwrite((unsigned char*)&zer[0], zippedEventRowsLength, 1, fileOutBin_);

    // Overwrite with actual size of compressed buffer
    idx_.size = zippedEventRowsLength;

    eventRows_.clear();   // Reset

  }

  fwrite(&idx_, sizeof(idx_), 1, fileOutIdx_);

  // Write uncompressed size to index file if requested (only relevant for
  // zipped footprint files)
  if (uncompressedSize_) {
    long long originalSize = rowCount_ * sizeof(EventRow);
    fwrite(&originalSize, sizeof(originalSize), 1, fileOutIdx_);
  }

  // Set new offset and reset row counter
  idx_.offset += idx_.size;
  rowCount_ = 0;

}